

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O1

bool __thiscall
sptk::StatisticsAccumulation::GetUnbiasedCovariance
          (StatisticsAccumulation *this,Buffer *buffer,SymmetricMatrix *unbiased_covariance)

{
  int iVar1;
  bool bVar2;
  double *pdVar3;
  int j;
  int column;
  int iVar4;
  int iVar5;
  Row local_48;
  
  if (this->is_valid_ != true) {
    return false;
  }
  if (this->num_statistics_order_ < 2) {
    return false;
  }
  if (this->diagonal_ == false) {
    if (unbiased_covariance == (SymmetricMatrix *)0x0) {
      return false;
    }
    if (buffer->zeroth_order_statistics_ < 2) {
      return false;
    }
    bVar2 = GetFullCovariance(this,buffer,unbiased_covariance);
    if (bVar2) {
      if (this->num_order_ < 0) {
        return true;
      }
      iVar1 = buffer->zeroth_order_statistics_;
      iVar4 = 1;
      iVar5 = 0;
      do {
        column = 0;
        do {
          local_48._vptr_Row = (_func_int **)&PTR__Row_00117bb0;
          local_48.matrix_ = unbiased_covariance;
          local_48.row_ = iVar5;
          pdVar3 = SymmetricMatrix::Row::operator[](&local_48,column);
          *pdVar3 = *pdVar3 * ((double)iVar1 / (double)(iVar1 + -1));
          column = column + 1;
        } while (iVar4 != column);
        iVar4 = iVar4 + 1;
        bVar2 = iVar5 < this->num_order_;
        iVar5 = iVar5 + 1;
      } while (bVar2);
      return true;
    }
  }
  return false;
}

Assistant:

bool StatisticsAccumulation::GetUnbiasedCovariance(
    const StatisticsAccumulation::Buffer& buffer,
    SymmetricMatrix* unbiased_covariance) const {
  if (!is_valid_ || num_statistics_order_ < 2 || diagonal_ ||
      buffer.zeroth_order_statistics_ <= 1 || NULL == unbiased_covariance) {
    return false;
  }

  if (!GetFullCovariance(buffer, unbiased_covariance)) {
    return false;
  }

  const double z(static_cast<double>(buffer.zeroth_order_statistics_) /
                 (buffer.zeroth_order_statistics_ - 1));
  for (int i(0); i <= num_order_; ++i) {
    for (int j(0); j <= i; ++j) {
      (*unbiased_covariance)[i][j] *= z;
    }
  }

  return true;
}